

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O3

Index __thiscall wasm::Pusher::optimizeSegment(Pusher *this,Index firstPushable,Index pushPoint)

{
  ulong uVar1;
  Expression **ppEVar2;
  bool bVar3;
  uint uVar4;
  ExpressionList *pEVar5;
  EffectAnalyzer *other;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_1c8 [8];
  EffectAnalyzer cumulativeEffects;
  LocalSet *pushable;
  void *pvStack_58;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> toPush;
  
  if ((pushPoint <= firstPushable) || (uVar8 = (ulong)pushPoint, pushPoint == 0xffffffff)) {
    __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                  ,0xb6,"Index wasm::Pusher::optimizeSegment(Index, Index)");
  }
  cumulativeEffects._0_8_ = this->module;
  local_1c8[0] = this->passOptions->ignoreImplicitTraps;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.localsRead;
  local_1c8[1] = this->passOptions->trapsNeverHappen;
  cumulativeEffects.module._0_4_ = (((Module *)cumulativeEffects._0_8_)->features).features;
  cumulativeEffects.module._4_2_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.localsWritten;
  cumulativeEffects.localsWritten._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.mutableGlobalsRead;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.globalsWritten;
  cumulativeEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.breakTargets;
  cumulativeEffects.breakTargets._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.readsMemory = false;
  cumulativeEffects.writesMemory = false;
  cumulativeEffects.readsTable = false;
  cumulativeEffects.writesTable = false;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cumulativeEffects.trap = false;
  cumulativeEffects.implicitTrap = false;
  cumulativeEffects.isAtomic = false;
  cumulativeEffects.throws_ = false;
  cumulativeEffects._228_4_ = 0;
  cumulativeEffects.tryDepth._0_7_ = 0;
  cumulativeEffects._239_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.delegateTargets;
  cumulativeEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (uVar8 < (this->list->
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
              usedElements) {
    EffectAnalyzer::walk
              ((EffectAnalyzer *)local_1c8,
               (this->list->
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
               [uVar8]);
    EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_1c8);
    pvStack_58 = (void *)0x0;
    toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar9 = (ulong)(pushPoint - 1);
    pEVar5 = this->list;
    if (uVar9 < (pEVar5->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                .usedElements) {
      uVar11 = (ulong)firstPushable;
      do {
        cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)isPushable(this,(pEVar5->
                                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ).data[uVar9]);
        if ((LocalSet *)
            cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count ==
            (LocalSet *)0x0) {
          if ((this->list->
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
              usedElements <= uVar9) break;
          EffectAnalyzer::walk
                    ((EffectAnalyzer *)local_1c8,
                     (this->list->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data[uVar9]);
        }
        else {
          other = getPushableEffects(this,(LocalSet *)
                                          cumulativeEffects.delegateTargets._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count);
          bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_1c8,other);
          if (bVar3) {
            EffectAnalyzer::mergeIn((EffectAnalyzer *)local_1c8,other);
          }
          else if (toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                   _M_impl.super__Vector_impl_data._M_start ==
                   toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::
            _M_realloc_insert<wasm::LocalSet*const&>
                      ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)&pvStack_58,
                       (iterator)
                       toPush.
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (LocalSet **)
                       &cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
          }
          else {
            *toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
             super__Vector_impl_data._M_start =
                 (LocalSet *)
                 cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        if (uVar11 == uVar9) {
          if ((long)toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)pvStack_58 == 0)
          goto LAB_007effc9;
          uVar9 = (ulong)((long)toPush.
                                super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_58) >> 3;
          iVar6 = (pushPoint - firstPushable) + 1;
          uVar7 = 0;
          goto LAB_007eff2a;
        }
        bVar3 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar3) {
          __assert_fail("i > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                        ,0xde,"Index wasm::Pusher::optimizeSegment(Index, Index)");
        }
        pEVar5 = this->list;
      } while (uVar9 < (pEVar5->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       usedElements);
    }
  }
LAB_007efee9:
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
LAB_007eff2a:
  do {
    uVar4 = (uint)uVar9;
    if (uVar7 < uVar4) {
      if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= uVar11) goto LAB_007efee9;
      if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          data[uVar11] != *(Expression **)((long)pvStack_58 + (ulong)(~uVar7 + uVar4) * 8))
      goto LAB_007eff4e;
      uVar7 = uVar7 + 1;
    }
    else {
LAB_007eff4e:
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar1 = (this->list->
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                usedElements;
        if ((uVar1 <= uVar11) || (uVar10 = (ulong)((int)uVar11 - uVar7), uVar1 <= uVar10))
        goto LAB_007efee9;
        ppEVar2 = (this->list->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data;
        ppEVar2[uVar10] = ppEVar2[uVar11];
      }
    }
    uVar11 = uVar11 + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (uVar7 != uVar4) {
    __assert_fail("skip == total",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                  ,0xf4,"Index wasm::Pusher::optimizeSegment(Index, Index)");
  }
  if (uVar4 != 0) {
    uVar11 = 0;
    do {
      if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= uVar8) goto LAB_007efee9;
      (this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
      [uVar8] = *(Expression **)((long)pvStack_58 + uVar11 * 8);
      uVar11 = uVar11 + 1;
      uVar8 = (ulong)((int)uVar8 - 1);
    } while ((uVar9 & 0xffffffff) != uVar11);
  }
  pushPoint = pushPoint - uVar4;
LAB_007effc9:
  if (pvStack_58 != (void *)0x0) {
    operator_delete(pvStack_58,
                    (long)toPush.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&cumulativeEffects.features);
  return pushPoint + 1;
}

Assistant:

Index optimizeSegment(Index firstPushable, Index pushPoint) {
    // The interesting part. Starting at firstPushable, try to push
    // code past pushPoint. We start at the end since we are pushing
    // forward, that way we can push later things out of the way
    // of earlier ones. Once we know all we can push, we push it all
    // in one pass, keeping the order of the pushables intact.
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);
    // everything that matters if you want to be pushed past the pushPoint
    EffectAnalyzer cumulativeEffects(passOptions, module);
    cumulativeEffects.walk(list[pushPoint]);
    // It is ok to ignore branching out of the block here, that is the crucial
    // point of this optimization. That is, we are in a situation like this:
    //
    // {
    //   x = value;
    //   if (..) break;
    //   foo(x);
    // }
    //
    // If the branch is taken, then that's fine, it will jump out of this block
    // and reach some outer scope, and in that case we never need x at all
    // (since we've proven before that x is not used outside of this block, see
    // numGetsSoFar which we use for that). Similarly, control flow could
    // transfer away via a return or an exception and that would be ok as well.
    cumulativeEffects.ignoreControlFlowTransfers();
    std::vector<LocalSet*> toPush;
    Index i = pushPoint - 1;
    while (1) {
      auto* pushable = isPushable(list[i]);
      if (pushable) {
        const auto& effects = getPushableEffects(pushable);
        if (cumulativeEffects.invalidates(effects)) {
          // we can't push this, so further pushables must pass it
          cumulativeEffects.mergeIn(effects);
        } else {
          // we can push this, great!
          toPush.push_back(pushable);
        }
      } else {
        // something that can't be pushed, so it might block further pushing
        cumulativeEffects.walk(list[i]);
      }
      if (i == firstPushable) {
        // no point in looking further
        break;
      }
      assert(i > 0);
      i--;
    }
    if (toPush.size() == 0) {
      // nothing to do, can only continue after the push point
      return pushPoint + 1;
    }
    // we have work to do!
    Index total = toPush.size();
    Index last = total - 1;
    Index skip = 0;
    for (Index i = firstPushable; i <= pushPoint; i++) {
      // we see the first elements at the end of toPush
      if (skip < total && list[i] == toPush[last - skip]) {
        // this is one of our elements to push, skip it
        skip++;
      } else {
        if (skip) {
          list[i - skip] = list[i];
        }
      }
    }
    assert(skip == total);
    // write out the skipped elements
    for (Index i = 0; i < total; i++) {
      list[pushPoint - i] = toPush[i];
    }
    // proceed right after the push point, we may push the pushed elements again
    return pushPoint - total + 1;
  }